

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,TokenList *args_3)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_type sVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  ConditionalBranchDirectiveSyntax *pCVar14;
  
  pCVar14 = (ConditionalBranchDirectiveSyntax *)allocate(this,0x60,8);
  SVar1 = *args;
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pCVar14->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar14->super_DirectiveSyntax).super_SyntaxNode.kind = SVar1;
  (pCVar14->super_DirectiveSyntax).directive.kind = TVar5;
  (pCVar14->super_DirectiveSyntax).directive.field_0x2 = uVar6;
  (pCVar14->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar14->super_DirectiveSyntax).directive.rawLen = uVar8;
  (pCVar14->super_DirectiveSyntax).directive.info = pIVar2;
  (pCVar14->name).kind = TVar9;
  (pCVar14->name).field_0x2 = uVar10;
  (pCVar14->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar14->name).rawLen = uVar12;
  (pCVar14->name).info = pIVar3;
  SVar1 = (args_3->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar13 = *(undefined4 *)&(args_3->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pCVar14->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_3->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar14->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind = SVar1;
  *(undefined4 *)&(pCVar14->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar13
  ;
  (pCVar14->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (pCVar14->disabledTokens).super_SyntaxListBase.childCount =
       (args_3->super_SyntaxListBase).childCount;
  sVar4 = (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pCVar14->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args_3->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pCVar14->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar4;
  (pCVar14->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0046feb0;
  (pCVar14->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar14;
  return pCVar14;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }